

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool ON_IsOrthonormalFrame(ON_2dVector *X,ON_2dVector *Y)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  bVar1 = ON_IsOrthogonalFrame(X,Y);
  if (bVar1) {
    dVar3 = ABS(X->x);
    dVar4 = ABS(X->y);
    dVar2 = dVar4;
    if (dVar4 <= dVar3) {
      dVar2 = dVar3;
    }
    if (dVar2 <= 2.2250738585072014e-308) {
      if (dVar2 <= 0.0) {
        dVar2 = 0.0;
      }
    }
    else {
      if (dVar4 <= dVar3) {
        dVar3 = dVar4;
      }
      dVar2 = dVar2 * SQRT((dVar3 / dVar2) * (dVar3 / dVar2) + 1.0);
    }
    if (ABS(dVar2 + -1.0) <= 1.490116119385e-08) {
      dVar3 = ABS(Y->x);
      dVar4 = ABS(Y->y);
      dVar2 = dVar4;
      if (dVar4 <= dVar3) {
        dVar2 = dVar3;
      }
      if (dVar2 <= 2.2250738585072014e-308) {
        if (dVar2 <= 0.0) {
          dVar2 = 0.0;
        }
      }
      else {
        if (dVar4 <= dVar3) {
          dVar3 = dVar4;
        }
        dVar2 = dVar2 * SQRT((dVar3 / dVar2) * (dVar3 / dVar2) + 1.0);
      }
      return ABS(dVar2 + -1.0) <= 1.490116119385e-08;
    }
  }
  return false;
}

Assistant:

bool ON_IsOrthonormalFrame( const ON_2dVector& X,  const ON_2dVector& Y )
{
  // returns true if X, Y, Z is an orthonormal frame
  if ( !ON_IsOrthogonalFrame( X, Y ) )
    return false;
  double x = X.Length();
  if ( fabs(x-1.0) >  ON_SQRT_EPSILON )
    return false;
  x = Y.Length();
  if ( fabs(x-1.0) >  ON_SQRT_EPSILON )
    return false;

  return true;
}